

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,uint Insn,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint Reg;
  uint Reg_00;
  uint uVar3;
  int64_t Val;
  uint in_ESI;
  MCInst *in_RDI;
  uint Base;
  uint Rt;
  int64_t Offset;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  
  Val = SignExtend64((ulong)(in_ESI >> 7 & 0x1ff),9);
  uVar1 = fieldFromInstruction(in_ESI,0x10,5);
  uVar2 = fieldFromInstruction(in_ESI,0x15,5);
  Reg = getReg((MCRegisterInfo *)CONCAT44(uVar1,uVar2),in_stack_ffffffffffffffcc,
               in_stack_ffffffffffffffc8);
  Reg_00 = getReg((MCRegisterInfo *)CONCAT44(Reg,uVar2),in_stack_ffffffffffffffcc,
                  in_stack_ffffffffffffffc8);
  uVar3 = MCInst_getOpcode(in_RDI);
  if (uVar3 != 0x596) {
    uVar3 = MCInst_getOpcode(in_RDI);
    if (uVar3 != 0x594) goto LAB_00305192;
  }
  MCOperand_CreateReg0(in_RDI,Reg);
LAB_00305192:
  MCOperand_CreateReg0(in_RDI,Reg);
  MCOperand_CreateReg0(in_RDI,Reg_00);
  MCOperand_CreateImm0(in_RDI,Val);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus DecodeSpecial3LlSc(MCInst *Inst,
		unsigned Insn, uint64_t Address, const MCRegisterInfo *Decoder)
{
	int64_t Offset = SignExtend64((Insn >> 7) & 0x1ff, 9);
	unsigned Rt = fieldFromInstruction(Insn, 16, 5);
	unsigned Base = fieldFromInstruction(Insn, 21, 5);

	Rt = getReg(Decoder, Mips_GPR32RegClassID, Rt);
	Base = getReg(Decoder, Mips_GPR32RegClassID, Base);

	if (MCInst_getOpcode(Inst) == Mips_SC_R6 ||
			MCInst_getOpcode(Inst) == Mips_SCD_R6) {
		MCOperand_CreateReg0(Inst, Rt);
	}

	MCOperand_CreateReg0(Inst, Rt);
	MCOperand_CreateReg0(Inst, Base);
	MCOperand_CreateImm0(Inst, Offset);

	return MCDisassembler_Success;
}